

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::ServiceDescriptor::CopyTo(ServiceDescriptor *this,ServiceDescriptorProto *proto)

{
  byte *pbVar1;
  ushort *puVar2;
  MethodDescriptor *pMVar3;
  FeatureSet *from;
  MethodDescriptorProto *proto_00;
  ServiceOptions *this_00;
  ServiceOptions *pSVar4;
  FeatureSet *this_01;
  Arena *pAVar5;
  long lVar6;
  long lVar7;
  string_view value;
  
  puVar2 = (ushort *)(this->all_names_).payload_;
  value._M_len = (ulong)*puVar2;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  value._M_str = (char *)((long)puVar2 + ~value._M_len);
  pAVar5 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,pAVar5);
  if (0 < this->method_count_) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      pMVar3 = this->methods_;
      proto_00 = (MethodDescriptorProto *)
                 internal::RepeatedPtrFieldBase::AddMessageLite
                           (&(proto->field_0)._impl_.method_.super_RepeatedPtrFieldBase,
                            Arena::DefaultConstruct<google::protobuf::MethodDescriptorProto>);
      MethodDescriptor::CopyTo((MethodDescriptor *)(&pMVar3->super_SymbolBase + lVar7),proto_00);
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x50;
    } while (lVar6 < this->method_count_);
  }
  pSVar4 = this->options_;
  if (pSVar4 != (ServiceOptions *)_ServiceOptions_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    this_00 = (proto->field_0)._impl_.options_;
    if (this_00 == (ServiceOptions *)0x0) {
      pAVar5 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      this_00 = (ServiceOptions *)Arena::DefaultConstruct<google::protobuf::ServiceOptions>(pAVar5);
      (proto->field_0)._impl_.options_ = this_00;
    }
    ServiceOptions::CopyFrom(this_00,pSVar4);
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    pSVar4 = (proto->field_0)._impl_.options_;
    if (pSVar4 == (ServiceOptions *)0x0) {
      pAVar5 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      pSVar4 = (ServiceOptions *)Arena::DefaultConstruct<google::protobuf::ServiceOptions>(pAVar5);
      (proto->field_0)._impl_.options_ = pSVar4;
    }
    pbVar1 = (byte *)((long)&pSVar4->field_0 + 0x18);
    *pbVar1 = *pbVar1 | 1;
    this_01 = (pSVar4->field_0)._impl_.features_;
    if (this_01 == (FeatureSet *)0x0) {
      pAVar5 = (Arena *)(pSVar4->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      this_01 = (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar5);
      (pSVar4->field_0)._impl_.features_ = this_01;
    }
    FeatureSet::CopyFrom(this_01,from);
    return;
  }
  return;
}

Assistant:

void ServiceDescriptor::CopyTo(ServiceDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < method_count(); i++) {
    method(i)->CopyTo(proto->add_method());
  }

  if (&options() != &ServiceOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}